

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O1

int process_aggregate_arg
              (c2m_ctx_t c2m_ctx,type *arg_type,target_arg_info_t *arg_info,MIR_type_t *qword_types)

{
  MIR_type_t MVar1;
  uint n;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  n = classify_arg(c2m_ctx,arg_type,qword_types,(int)qword_types);
  uVar2 = 0;
  if ((n != 0) && ((arg_type->mode & ~TM_BASIC) == TM_STRUCT)) {
    update_last_qword_type(c2m_ctx,arg_type,qword_types,n);
    iVar4 = 0;
    iVar3 = 0;
    if (0 < (int)n) {
      uVar5 = 0;
      iVar3 = 0;
      iVar4 = 0;
      do {
        MVar1 = qword_types[uVar5];
        if (0x15 < MVar1) {
LAB_0019d2ad:
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                        ,0x141,
                        "int process_aggregate_arg(c2m_ctx_t, struct type *, target_arg_info_t *, MIR_type_t *)"
                       );
        }
        if ((0x55U >> (MVar1 & 0x1f) & 1) == 0) {
          if ((0x300U >> (MVar1 & 0x1f) & 1) == 0) {
            if ((0x200400U >> (MVar1 & 0x1f) & 1) != 0) {
              return 0;
            }
            goto LAB_0019d2ad;
          }
          iVar3 = iVar3 + 1;
        }
        else {
          iVar4 = iVar4 + 1;
        }
        uVar5 = uVar5 + 1;
      } while (n != uVar5);
    }
    iVar4 = iVar4 + arg_info->n_iregs;
    uVar2 = 0;
    if ((iVar4 < 7) && (iVar3 = iVar3 + arg_info->n_fregs, iVar3 < 9)) {
      arg_info->n_iregs = iVar4;
      arg_info->n_fregs = iVar3;
      uVar2 = n;
    }
  }
  return uVar2;
}

Assistant:

static int process_aggregate_arg (c2m_ctx_t c2m_ctx, struct type *arg_type,
                                  target_arg_info_t *arg_info, MIR_type_t qword_types[MAX_QWORDS]) {
  MIR_type_t type;
  int n, n_iregs, n_fregs, n_qwords = classify_arg (c2m_ctx, arg_type, qword_types, FALSE);

  if (n_qwords == 0) return 0;
  if (arg_type->mode != TM_STRUCT && arg_type->mode != TM_UNION) return 0;
  update_last_qword_type (c2m_ctx, arg_type, qword_types, n_qwords);
  n_iregs = n_fregs = 0;
  for (n = 0; n < n_qwords; n++) { /* start from the last qword */
    switch ((int) (type = qword_types[n])) {
    case MIR_T_I8:
    case MIR_T_I16:
    case MIR_T_I32:
    case MIR_T_I64: n_iregs++; break;
    case MIR_T_F:
    case MIR_T_D: n_fregs++; break;
    case X87UP_CLASS:
    case MIR_T_LD: return 0;
    default: assert (FALSE);
    }
  }
  if (arg_info->n_iregs + n_iregs > 6 || arg_info->n_fregs + n_fregs > 8) return 0;
  /* aggregate passed by value: update arg_info */
  arg_info->n_iregs += n_iregs;
  arg_info->n_fregs += n_fregs;
  return n_qwords;
}